

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# python_generator.cc
# Opt level: O0

void __thiscall
google::protobuf::compiler::python::Generator::PrintDescriptor
          (Generator *this,Descriptor *message_descriptor)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  Generator *this_00;
  DescriptorProto *proto;
  string *psVar4;
  mapped_type *pmVar5;
  FileDescriptor *this_01;
  Generator *this_02;
  string *__s;
  int __c;
  Descriptor *in_RSI;
  DescriptorProto edp;
  string options_string_1;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m_1;
  OneofDescriptor *desc;
  int i_3;
  ExtensionRange *range;
  int i_2;
  string options_string;
  string descriptor_name;
  int i_1;
  string nested_name;
  int i;
  char required_function_arguments [91];
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  m;
  string *in_stack_fffffffffffff948;
  char *__rhs;
  MessageLite *in_stack_fffffffffffff950;
  DescriptorProto *this_03;
  Descriptor *in_stack_fffffffffffff958;
  Generator *in_stack_fffffffffffff960;
  allocator *in_stack_fffffffffffff978;
  AlphaNum *in_stack_fffffffffffff988;
  OneofOptions *in_stack_fffffffffffff990;
  mapped_type *in_stack_fffffffffffff998;
  DescriptorProto *in_stack_fffffffffffff9a0;
  undefined4 in_stack_fffffffffffff9a8;
  undefined4 in_stack_fffffffffffff9ac;
  Printer *in_stack_fffffffffffff9b0;
  char (*in_stack_fffffffffffff9b8) [11];
  allocator *paVar6;
  Printer *in_stack_fffffffffffff9c0;
  Generator *in_stack_fffffffffffff9c8;
  Generator *in_stack_fffffffffffff9d0;
  Printer *in_stack_fffffffffffff9d8;
  char (*in_stack_fffffffffffff9f0) [7];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_stack_fffffffffffff9f8;
  Descriptor *in_stack_fffffffffffffa30;
  Generator *in_stack_fffffffffffffa38;
  Generator *in_stack_fffffffffffffa48;
  allocator *descriptor;
  char *in_stack_fffffffffffffb30;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  *in_stack_fffffffffffffb38;
  Printer *in_stack_fffffffffffffb40;
  allocator local_461;
  string local_460 [32];
  string local_440 [39];
  allocator local_419;
  string local_418 [32];
  string local_3f8 [32];
  string local_3d8 [39];
  undefined1 local_3b1 [81];
  AlphaNum local_360;
  allocator local_311;
  string local_310 [80];
  OneofDescriptor *local_2c0;
  int local_2b4;
  string local_280 [80];
  string local_230 [32];
  ExtensionRange *local_210;
  int local_204;
  undefined1 local_200 [40];
  string local_1d8 [32];
  string local_1b8 [32];
  string local_198 [36];
  int local_174;
  string local_170 [36];
  int local_14c;
  Rep *local_148;
  Arena *pAStack_140;
  undefined8 local_138;
  Rep *pRStack_130;
  ArenaStringPtr local_128;
  MessageOptions *pMStack_120;
  char local_118 [55];
  allocator local_e1;
  string local_e0 [39];
  allocator local_b9;
  string local_b8 [39];
  allocator local_91;
  string local_90 [96];
  string local_30 [32];
  Descriptor *local_10;
  
  local_10 = in_RSI;
  PrintNestedDescriptors(in_stack_fffffffffffff960,in_stack_fffffffffffff958);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  ModuleLevelDescriptorName<google::protobuf::Descriptor>
            (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
  io::Printer::Print<char[16],std::__cxx11::string>
            (in_stack_fffffffffffff9b0,
             (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
             (char (*) [16])in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
  std::__cxx11::string::~string(local_30);
  io::Printer::Indent((Printer *)0x4bece0);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x4beced);
  this_00 = (Generator *)Descriptor::name_abi_cxx11_(local_10);
  descriptor = &local_91;
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_90,"name",descriptor);
  proto = (DescriptorProto *)
          std::
          map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
  std::__cxx11::string::operator=((string *)proto,(string *)this_00);
  std::__cxx11::string::~string(local_90);
  std::allocator<char>::~allocator((allocator<char> *)&local_91);
  psVar4 = Descriptor::full_name_abi_cxx11_(local_10);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"full_name",&local_b9);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
  std::__cxx11::string::operator=((string *)pmVar5,(string *)psVar4);
  std::__cxx11::string::~string(local_b8);
  std::allocator<char>::~allocator((allocator<char> *)&local_b9);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"file",&local_e1);
  pmVar5 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
  std::__cxx11::string::operator=((string *)pmVar5,"DESCRIPTOR");
  std::__cxx11::string::~string(local_e0);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  builtin_strncpy(local_118 + 0x20,"ype=None,\n",0xb);
  builtin_strncpy(local_118 + 0x10,"e$,\ncontaining_t",0x10);
  builtin_strncpy(local_118,"=None,\nfile=$fil",0x10);
  local_128.ptr_ = (string *)0xa2c2724656d616e;
  pMStack_120 = (MessageOptions *)0x656d616e656c6966;
  local_138 = 0x656d616e5f6c6c75;
  pRStack_130 = (Rep *)0x5f6c6c756624273d;
  local_148 = (Rep *)0x6e24273d656d616e;
  pAStack_140 = (Arena *)0x660a2c2724656d61;
  io::Printer::Print(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30);
  PrintFieldsInDescriptor(in_stack_fffffffffffff9d0,(Descriptor *)in_stack_fffffffffffff9c8);
  PrintExtensionsInDescriptor(in_stack_fffffffffffff9d0,(Descriptor *)in_stack_fffffffffffff9c8);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  local_14c = 0;
  while( true ) {
    iVar3 = local_14c;
    iVar2 = Descriptor::nested_type_count(local_10);
    if (iVar2 <= iVar3) break;
    in_stack_fffffffffffffa48 = (Generator *)Descriptor::nested_type(local_10,local_14c);
    ModuleLevelDescriptorName<google::protobuf::Descriptor>
              (in_stack_fffffffffffffa38,in_stack_fffffffffffffa30);
    io::Printer::Print<char[5],std::__cxx11::string>
              (in_stack_fffffffffffff9b0,
               (char *)CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (char (*) [5])in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    std::__cxx11::string::~string(local_170);
    local_14c = local_14c + 1;
  }
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  io::Printer::Indent((Printer *)0x4bf1bb);
  local_174 = 0;
  while( true ) {
    iVar3 = local_174;
    iVar2 = Descriptor::enum_type_count(local_10);
    if (iVar2 <= iVar3) break;
    Descriptor::enum_type(local_10,local_174);
    ModuleLevelDescriptorName<google::protobuf::EnumDescriptor>
              (in_stack_fffffffffffffa48,(EnumDescriptor *)CONCAT44(iVar2,iVar3));
    std::__cxx11::string::c_str();
    io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
    io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
    std::__cxx11::string::~string(local_198);
    local_174 = local_174 + 1;
  }
  io::Printer::Outdent(in_stack_fffffffffffff9b0);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  std::__cxx11::string::string(local_1b8);
  Descriptor::options(local_10);
  MessageLite::SerializeToString(in_stack_fffffffffffff950,in_stack_fffffffffffff948);
  OptionsValue(in_stack_fffffffffffff9c8,(string *)in_stack_fffffffffffff9c0);
  iVar3 = Descriptor::extension_range_count(local_10);
  local_200._32_8_ = "False";
  if (0 < iVar3) {
    local_200._32_8_ = "True";
  }
  this_01 = Descriptor::file(local_10);
  FileDescriptor::syntax(this_01);
  (anonymous_namespace)::StringifySyntax_abi_cxx11_
            ((Syntax)((ulong)in_stack_fffffffffffff9c8 >> 0x20));
  this_03 = (DescriptorProto *)local_200;
  __rhs = "syntax";
  io::Printer::
  Print<char[14],std::__cxx11::string,char[11],char_const*,char[7],std::__cxx11::string>
            (in_stack_fffffffffffff9d8,(char *)in_stack_fffffffffffff9d0,
             (char (*) [14])in_stack_fffffffffffff9c8,
             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8,(char **)in_stack_fffffffffffff9b0,
             in_stack_fffffffffffff9f0,in_stack_fffffffffffff9f8);
  std::__cxx11::string::~string((string *)local_200);
  std::__cxx11::string::~string((string *)(local_200 + 0x28));
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  local_204 = 0;
  while( true ) {
    iVar3 = local_204;
    iVar2 = Descriptor::extension_range_count(local_10);
    if (iVar2 <= iVar3) break;
    local_210 = Descriptor::extension_range(local_10,local_204);
    strings::AlphaNum::AlphaNum((AlphaNum *)this_03,(int)((ulong)__rhs >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffff988);
    strings::AlphaNum::AlphaNum((AlphaNum *)this_03,(int)((ulong)__rhs >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffff988);
    io::Printer::Print<char[6],std::__cxx11::string,char[4],std::__cxx11::string>
              (in_stack_fffffffffffff9c0,*in_stack_fffffffffffff9b8,
               &in_stack_fffffffffffff9b0->variable_delimiter_,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               CONCAT44(in_stack_fffffffffffff9ac,in_stack_fffffffffffff9a8),
               (char (*) [4])in_stack_fffffffffffff9a0,in_stack_fffffffffffff998);
    std::__cxx11::string::~string(local_280);
    std::__cxx11::string::~string(local_230);
    local_204 = local_204 + 1;
  }
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  io::Printer::Indent((Printer *)0x4bf6bb);
  local_2b4 = 0;
  while( true ) {
    iVar3 = local_2b4;
    iVar2 = Descriptor::oneof_decl_count(local_10);
    if (iVar2 <= iVar3) break;
    local_2c0 = Descriptor::oneof_decl(local_10,local_2b4);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
           *)0x4bf73d);
    psVar4 = OneofDescriptor::name_abi_cxx11_(local_2c0);
    paVar6 = &local_311;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_310,"name",paVar6);
    this_02 = (Generator *)
              std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                            *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
    std::__cxx11::string::operator=((string *)this_02,(string *)psVar4);
    std::__cxx11::string::~string(local_310);
    std::allocator<char>::~allocator((allocator<char> *)&local_311);
    __s = OneofDescriptor::full_name_abi_cxx11_(local_2c0);
    paVar6 = (allocator *)(local_360.digits + 0x17);
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)(local_360.digits + 0x18),"full_name",paVar6);
    in_stack_fffffffffffff9b0 =
         (Printer *)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
    psVar4 = __s;
    std::__cxx11::string::operator=((string *)in_stack_fffffffffffff9b0,(string *)__s);
    std::__cxx11::string::~string((string *)(local_360.digits + 0x18));
    std::allocator<char>::~allocator((allocator<char> *)(local_360.digits + 0x17));
    OneofDescriptor::index(local_2c0,(char *)__s,__c);
    strings::AlphaNum::AlphaNum((AlphaNum *)this_03,(int)((ulong)__rhs >> 0x20));
    StrCat_abi_cxx11_(in_stack_fffffffffffff988);
    in_stack_fffffffffffff9a0 = (DescriptorProto *)local_3b1;
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              ((string *)(local_3b1 + 1),"index",(allocator *)in_stack_fffffffffffff9a0);
    in_stack_fffffffffffff998 =
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                       *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
    in_stack_fffffffffffff988 = &local_360;
    std::__cxx11::string::operator=
              ((string *)in_stack_fffffffffffff998,(string *)in_stack_fffffffffffff988);
    std::__cxx11::string::~string((string *)(local_3b1 + 1));
    std::allocator<char>::~allocator((allocator<char> *)local_3b1);
    std::__cxx11::string::~string((string *)in_stack_fffffffffffff988);
    in_stack_fffffffffffff990 = OneofDescriptor::options(local_2c0);
    MessageLite::SerializeAsString_abi_cxx11_((MessageLite *)in_stack_fffffffffffff978);
    OptionsValue(this_02,psVar4);
    std::__cxx11::string::~string(local_3f8);
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            this_03,__rhs);
    if (bVar1) {
      in_stack_fffffffffffff978 = &local_419;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_418,"serialized_options",in_stack_fffffffffffff978);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
      std::__cxx11::string::operator=((string *)pmVar5,"");
      std::__cxx11::string::~string(local_418);
      std::allocator<char>::~allocator((allocator<char> *)&local_419);
    }
    else {
      std::operator+((char *)in_stack_fffffffffffff998,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     in_stack_fffffffffffff990);
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_460,"serialized_options",&local_461);
      pmVar5 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               ::operator[]((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)in_stack_fffffffffffff990,(key_type *)in_stack_fffffffffffff988);
      std::__cxx11::string::operator=((string *)pmVar5,local_440);
      std::__cxx11::string::~string(local_460);
      std::allocator<char>::~allocator((allocator<char> *)&local_461);
      std::__cxx11::string::~string(local_440);
    }
    io::Printer::Print(in_stack_fffffffffffffb40,in_stack_fffffffffffffb38,in_stack_fffffffffffffb30
                      );
    std::__cxx11::string::~string(local_3d8);
    std::
    map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
            *)0x4bfcd0);
    local_2b4 = local_2b4 + 1;
  }
  io::Printer::Outdent(in_stack_fffffffffffff9b0);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  DescriptorProto::DescriptorProto(in_stack_fffffffffffff9a0);
  PrintSerializedPbInterval<google::protobuf::Descriptor,google::protobuf::DescriptorProto>
            (this_00,(Descriptor *)descriptor,proto);
  io::Printer::Outdent(in_stack_fffffffffffff9b0);
  io::Printer::Print<>((Printer *)in_stack_fffffffffffff9a0,(char *)in_stack_fffffffffffff998);
  DescriptorProto::~DescriptorProto(this_03);
  std::__cxx11::string::~string(local_1b8);
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
          *)0x4bfdb4);
  return;
}

Assistant:

void Generator::PrintDescriptor(const Descriptor& message_descriptor) const {
  PrintNestedDescriptors(message_descriptor);

  printer_->Print("\n");
  printer_->Print("$descriptor_name$ = _descriptor.Descriptor(\n",
                  "descriptor_name",
                  ModuleLevelDescriptorName(message_descriptor));
  printer_->Indent();
  std::map<std::string, std::string> m;
  m["name"] = message_descriptor.name();
  m["full_name"] = message_descriptor.full_name();
  m["file"] = kDescriptorKey;
  const char required_function_arguments[] =
      "name='$name$',\n"
      "full_name='$full_name$',\n"
      "filename=None,\n"
      "file=$file$,\n"
      "containing_type=None,\n";
  printer_->Print(m, required_function_arguments);
  PrintFieldsInDescriptor(message_descriptor);
  PrintExtensionsInDescriptor(message_descriptor);

  // Nested types
  printer_->Print("nested_types=[");
  for (int i = 0; i < message_descriptor.nested_type_count(); ++i) {
    const std::string nested_name =
        ModuleLevelDescriptorName(*message_descriptor.nested_type(i));
    printer_->Print("$name$, ", "name", nested_name);
  }
  printer_->Print("],\n");

  // Enum types
  printer_->Print("enum_types=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.enum_type_count(); ++i) {
    const std::string descriptor_name =
        ModuleLevelDescriptorName(*message_descriptor.enum_type(i));
    printer_->Print(descriptor_name.c_str());
    printer_->Print(",\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  std::string options_string;
  message_descriptor.options().SerializeToString(&options_string);
  printer_->Print(
      "serialized_options=$options_value$,\n"
      "is_extendable=$extendable$,\n"
      "syntax='$syntax$'",
      "options_value", OptionsValue(options_string), "extendable",
      message_descriptor.extension_range_count() > 0 ? "True" : "False",
      "syntax", StringifySyntax(message_descriptor.file()->syntax()));
  printer_->Print(",\n");

  // Extension ranges
  printer_->Print("extension_ranges=[");
  for (int i = 0; i < message_descriptor.extension_range_count(); ++i) {
    const Descriptor::ExtensionRange* range =
        message_descriptor.extension_range(i);
    printer_->Print("($start$, $end$), ", "start", StrCat(range->start),
                    "end", StrCat(range->end));
  }
  printer_->Print("],\n");
  printer_->Print("oneofs=[\n");
  printer_->Indent();
  for (int i = 0; i < message_descriptor.oneof_decl_count(); ++i) {
    const OneofDescriptor* desc = message_descriptor.oneof_decl(i);
    std::map<std::string, std::string> m;
    m["name"] = desc->name();
    m["full_name"] = desc->full_name();
    m["index"] = StrCat(desc->index());
    std::string options_string =
        OptionsValue(desc->options().SerializeAsString());
    if (options_string == "None") {
      m["serialized_options"] = "";
    } else {
      m["serialized_options"] = ", serialized_options=" + options_string;
    }
    printer_->Print(m,
                    "_descriptor.OneofDescriptor(\n"
                    "  name='$name$', full_name='$full_name$',\n"
                    "  index=$index$, containing_type=None, "
                    "fields=[]$serialized_options$),\n");
  }
  printer_->Outdent();
  printer_->Print("],\n");
  // Serialization of proto
  DescriptorProto edp;
  PrintSerializedPbInterval(message_descriptor, edp);

  printer_->Outdent();
  printer_->Print(")\n");
}